

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_part_type(_internal_exr_context *f,_internal_exr_part *curpart)

{
  bool bVar1;
  exr_result_t eVar2;
  exr_result_t unaff_EBP;
  
  if (curpart->type == (exr_attribute_t *)0x0) {
    return 0;
  }
  bVar1 = true;
  if (f->is_singlepart_tiled != '\0') {
    if (curpart->storage_mode == EXR_STORAGE_TILED) goto LAB_0012a3f9;
    curpart->storage_mode = EXR_STORAGE_TILED;
    bVar1 = false;
    unaff_EBP = 0xe;
    (*f->print_error)(f,0xe,
                      "attribute \'type\': Mismatch between file flags and type string \'%s\', believing file flags"
                      ,((curpart->type->field_6).chlist)->entries);
    if (f->mode == '\x01') goto LAB_0012a3f9;
    eVar2 = exr_attr_string_set_with_length
                      ((exr_context_t)f,(curpart->type->field_6).string,"tiledimage",10);
    if (eVar2 != 0) {
      bVar1 = false;
      unaff_EBP = (*f->print_error)(f,0xe,
                                    "attribute \'type\': Mismatch between file flags and type attribute, unable to fix"
                                   );
      goto LAB_0012a3f9;
    }
  }
  bVar1 = true;
LAB_0012a3f9:
  if (bVar1) {
    return 0;
  }
  return unaff_EBP;
}

Assistant:

static exr_result_t
validate_part_type (
    struct _internal_exr_context* f, struct _internal_exr_part* curpart)
{
    // TODO: there are probably more tests to add here...
    if (curpart->type)
    {
        int rv;

        // see if the type overwrote the storage mode
        if (f->is_singlepart_tiled &&
            curpart->storage_mode != EXR_STORAGE_TILED)
        {
            // mismatch between type attr and file flag. c++ believed the
            // flag first and foremost
            curpart->storage_mode = EXR_STORAGE_TILED;

            // TODO: define how strict we should be
            //exr_attr_list_remove( f, &(curpart->attributes), curpart->type );
            //curpart->type = NULL;
            f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "attribute 'type': Mismatch between file flags and type string '%s', believing file flags",
                curpart->type->string->str);

            if (f->mode == EXR_CONTEXT_WRITE) return EXR_ERR_INVALID_ATTR;

            rv = exr_attr_string_set_with_length (
                (exr_context_t) f, curpart->type->string, "tiledimage", 10);
            if (rv != EXR_ERR_SUCCESS)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "attribute 'type': Mismatch between file flags and type attribute, unable to fix");
        }
    }

    return EXR_ERR_SUCCESS;
}